

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O3

void __thiscall glTF::Asset::Asset(Asset *this,IOSystem *io)

{
  _Rb_tree_header *p_Var1;
  pointer *pppLVar2;
  AssetMetadata *this_00;
  LazyDict<glTF::Sampler> *pLVar3;
  iterator iVar4;
  vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>> *this_01;
  LazyDict<glTF::Accessor> *local_b0;
  vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>> *local_a8;
  vector<glTF::Light_*,_std::allocator<glTF::Light_*>_> *local_98;
  LazyDict<glTF::Sampler> *local_90;
  LazyDict<glTF::Node> *local_88;
  LazyDict<glTF::Mesh> *local_80;
  LazyDict<glTF::Material> *local_78;
  LazyDict<glTF::Image> *local_70;
  LazyDict<glTF::Camera> *local_68;
  LazyDict<glTF::BufferView> *local_60;
  LazyDict<glTF::Buffer> *local_58;
  LazyDict<glTF::Animation> *local_50;
  LazyDict<glTF::Accessor> *local_48;
  AssetMetadata *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->mIOSystem = io;
  local_38 = &(this->mCurrentAssetDir).field_2;
  (this->mCurrentAssetDir)._M_dataplus._M_p = (pointer)local_38;
  (this->mCurrentAssetDir)._M_string_length = 0;
  (this->mCurrentAssetDir).field_2._M_local_buf[0] = '\0';
  this_01 = (vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>> *)&this->mDicts;
  (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->mUsedIds)._M_t._M_impl.super__Rb_tree_header;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_00 = &this->asset;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mBodyBuffer).vector = (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0;
  (this->mBodyBuffer).index = 0;
  AssetMetadata::AssetMetadata(this_00);
  local_b0 = &this->accessors;
  (this->accessors).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fc778;
  (this->accessors).mObjs.super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->accessors).mObjs.super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->accessors).mObjs.super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->accessors).mDictId = "accessors";
  (this->accessors).mExtId = (char *)0x0;
  (this->accessors).mDict = (Value *)0x0;
  (this->accessors).mAsset = this;
  iVar4._M_current =
       (this->mDicts).
       super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = local_b0;
  local_40 = this_00;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = &local_b0->super_LazyDictBase;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->animations;
  (this->animations).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fc850;
  (this->animations).mObjs.super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animations).mObjs.super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->animations).mObjs.super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->animations).mDictId = "animations";
  (this->animations).mExtId = (char *)0x0;
  (this->animations).mDict = (Value *)0x0;
  (this->animations).mAsset = this;
  local_50 = (LazyDict<glTF::Animation> *)local_b0;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->buffers;
  (this->buffers).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fc8a0;
  (this->buffers).mObjs.super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers).mObjs.super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers).mObjs.super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->buffers).mDictId = "buffers";
  (this->buffers).mExtId = (char *)0x0;
  (this->buffers).mDict = (Value *)0x0;
  (this->buffers).mAsset = this;
  local_58 = (LazyDict<glTF::Buffer> *)local_b0;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->bufferViews;
  (this->bufferViews).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fc8f0;
  (this->bufferViews).mObjs.
  super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bufferViews).mObjs.
  super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bufferViews).mObjs.
  super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bufferViews).mDictId = "bufferViews";
  (this->bufferViews).mExtId = (char *)0x0;
  (this->bufferViews).mDict = (Value *)0x0;
  (this->bufferViews).mAsset = this;
  local_60 = (LazyDict<glTF::BufferView> *)local_b0;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->cameras;
  (this->cameras).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fc940;
  (this->cameras).mObjs.super__Vector_base<glTF::Camera_*,_std::allocator<glTF::Camera_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cameras).mObjs.super__Vector_base<glTF::Camera_*,_std::allocator<glTF::Camera_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cameras).mObjs.super__Vector_base<glTF::Camera_*,_std::allocator<glTF::Camera_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->cameras).mDictId = "cameras";
  (this->cameras).mExtId = (char *)0x0;
  (this->cameras).mDict = (Value *)0x0;
  (this->cameras).mAsset = this;
  local_68 = (LazyDict<glTF::Camera> *)local_b0;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->images;
  (this->images).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fc990;
  (this->images).mObjs.super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->images).mObjs.super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->images).mObjs.super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->images).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->images).mDictId = "images";
  (this->images).mExtId = (char *)0x0;
  (this->images).mDict = (Value *)0x0;
  (this->images).mAsset = this;
  local_70 = (LazyDict<glTF::Image> *)local_b0;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->materials;
  (this->materials).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fc9e0;
  (this->materials).mObjs.super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).mObjs.super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).mObjs.super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->materials).mDictId = "materials";
  (this->materials).mExtId = (char *)0x0;
  (this->materials).mDict = (Value *)0x0;
  (this->materials).mAsset = this;
  local_78 = (LazyDict<glTF::Material> *)local_b0;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->meshes;
  (this->meshes).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fca30;
  (this->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->meshes).mDictId = "meshes";
  (this->meshes).mExtId = (char *)0x0;
  (this->meshes).mDict = (Value *)0x0;
  (this->meshes).mAsset = this;
  local_80 = (LazyDict<glTF::Mesh> *)local_b0;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->nodes;
  (this->nodes).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fca80;
  (this->nodes).mObjs.super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).mObjs.super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).mObjs.super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->nodes).mDictId = "nodes";
  (this->nodes).mExtId = (char *)0x0;
  (this->nodes).mDict = (Value *)0x0;
  (this->nodes).mAsset = this;
  local_88 = (LazyDict<glTF::Node> *)local_b0;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  pLVar3 = &this->samplers;
  (this->samplers).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fcad0;
  (this->samplers).mObjs.super__Vector_base<glTF::Sampler_*,_std::allocator<glTF::Sampler_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samplers).mObjs.super__Vector_base<glTF::Sampler_*,_std::allocator<glTF::Sampler_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samplers).mObjs.super__Vector_base<glTF::Sampler_*,_std::allocator<glTF::Sampler_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->samplers).mDictId = "samplers";
  (this->samplers).mExtId = (char *)0x0;
  (this->samplers).mDict = (Value *)0x0;
  (this->samplers).mAsset = this;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_98 = (vector<glTF::Light_*,_std::allocator<glTF::Light_*>_> *)&(this->samplers).mObjs;
    local_b0 = (LazyDict<glTF::Accessor> *)pLVar3;
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = &pLVar3->super_LazyDictBase;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->scenes;
  (this->scenes).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fcb20;
  (this->scenes).mObjs.super__Vector_base<glTF::Scene_*,_std::allocator<glTF::Scene_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scenes).mObjs.super__Vector_base<glTF::Scene_*,_std::allocator<glTF::Scene_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scenes).mObjs.super__Vector_base<glTF::Scene_*,_std::allocator<glTF::Scene_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->scenes).mDictId = "scenes";
  (this->scenes).mExtId = (char *)0x0;
  (this->scenes).mDict = (Value *)0x0;
  (this->scenes).mAsset = this;
  local_90 = pLVar3;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->skins;
  (this->skins).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fcb70;
  (this->skins).mObjs.super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->skins).mObjs.super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skins).mObjs.super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->skins).mDictId = "skins";
  (this->skins).mExtId = (char *)0x0;
  (this->skins).mDict = (Value *)0x0;
  (this->skins).mAsset = this;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->textures;
  (this->textures).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fcbc0;
  (this->textures).mObjs.super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures).mObjs.super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->textures).mObjs.super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->textures).mDictId = "textures";
  (this->textures).mExtId = (char *)0x0;
  (this->textures).mDict = (Value *)0x0;
  (this->textures).mAsset = this;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_a8 = this_01;
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    this_01 = local_a8;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0 = (LazyDict<glTF::Accessor> *)&this->lights;
  (this->lights).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_007fcc10;
  (this->lights).mObjs.super__Vector_base<glTF::Light_*,_std::allocator<glTF::Light_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lights).mObjs.super__Vector_base<glTF::Light_*,_std::allocator<glTF::Light_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lights).mObjs.super__Vector_base<glTF::Light_*,_std::allocator<glTF::Light_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lights).mDictId = "lights";
  (this->lights).mExtId = "KHR_materials_common";
  (this->lights).mDict = (Value *)0x0;
  (this->lights).mAsset = this;
  if (iVar4._M_current ==
      (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_98 = &(this->lights).mObjs;
    std::vector<glTF::LazyDictBase*,std::allocator<glTF::LazyDictBase*>>::
    _M_realloc_insert<glTF::LazyDictBase*>(this_01,iVar4,(LazyDictBase **)&local_b0);
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0;
    pppLVar2 = &(this->mDicts).
                super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppLVar2 = *pppLVar2 + 1;
  }
  (this->scene).vector = (vector<glTF::Scene_*,_std::allocator<glTF::Scene_*>_> *)0x0;
  (this->scene).index = 0;
  (this->extensionsUsed).KHR_binary_glTF = false;
  (this->extensionsUsed).KHR_materials_common = false;
  return;
}

Assistant:

Asset(IOSystem* io = 0)
            : mIOSystem(io)
            , asset()
            , accessors     (*this, "accessors")
            , animations    (*this, "animations")
            , buffers       (*this, "buffers")
            , bufferViews   (*this, "bufferViews")
            , cameras       (*this, "cameras")
            , images        (*this, "images")
            , materials     (*this, "materials")
            , meshes        (*this, "meshes")
            , nodes         (*this, "nodes")
            //, programs    (*this, "programs")
            , samplers      (*this, "samplers")
            , scenes        (*this, "scenes")
            //, shaders     (*this, "shaders")
            , skins       (*this, "skins")
            //, techniques  (*this, "techniques")
            , textures      (*this, "textures")
            , lights        (*this, "lights", "KHR_materials_common")
        {
            memset(&extensionsUsed, 0, sizeof(extensionsUsed));
        }